

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall
blc::network::Socket::Socket(Socket *this,string *address,int port,bool block,int mode,int type)

{
  (this->super_stream)._vptr_stream = (_func_int **)&PTR_write_0011abb0;
  this->_socket = 0;
  std::__cxx11::string::string((string *)&this->_address,(string *)address);
  this->_port = port;
  this->_block = block;
  this->_mode = mode;
  this->_type = type;
  this->_opened = false;
  return;
}

Assistant:

blc::network::Socket::Socket(std::string address, int port, bool block, int mode, int type) :	_socket(0),
												_address(address),
												_port(port),
												_block(block),
												_mode(mode),
												_type(type),
												_opened(false) {
}